

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholdingValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)560>(Result *__return_storage_ptr__,Model *format)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  Type *pTVar4;
  long lVar5;
  uint uVar6;
  int index;
  undefined1 *puVar7;
  allocator<char> local_99;
  undefined1 local_98 [40];
  RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves;
  Result result;
  
  puVar7 = (undefined1 *)format->description_;
  if ((ModelDescription *)puVar7 == (ModelDescription *)0x0) {
    puVar7 = Specification::_ModelDescription_default_instance_;
  }
  Result::Result(&result);
  precisionrecallcurves.super_RepeatedPtrFieldBase.arena_._0_4_ = 0;
  validateModelDescription
            ((Result *)local_98,(ModelDescription *)puVar7,format->specificationversion_,
             (ValidationPolicy *)&precisionrecallcurves);
  Result::operator=(&result,(Result *)local_98);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  bVar3 = Result::good(&result);
  if (bVar3) {
    if (format->_oneof_case_[0] == 0x230) {
      puVar7 = (undefined1 *)(format->Type_).classconfidencethresholding_;
    }
    else {
      puVar7 = Specification::_ClassConfidenceThresholding_default_instance_;
    }
    google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
    RepeatedPtrField(&precisionrecallcurves,
                     &((ClassConfidenceThresholding *)puVar7)->precisionrecallcurves_);
    if (precisionrecallcurves.super_RepeatedPtrFieldBase.current_size_ < 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,
                 "The ClassConfidenceThresholding model has no precisionRecallCurves.",&local_99);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
LAB_00267b48:
      std::__cxx11::string::~string((string *)local_98);
    }
    else {
      for (index = 0; index != precisionrecallcurves.super_RepeatedPtrFieldBase.current_size_;
          index = index + 1) {
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->precisionvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        iVar1 = (((FloatVector *)puVar7)->vector_).current_size_;
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->precisionconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        if ((iVar1 == 0) || (iVar1 != (((FloatVector *)puVar7)->vector_).current_size_)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,"Zero length or mismatched precisionRecallCurves components"
                     ,&local_99);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
          goto LAB_00267b48;
        }
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->recallvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        iVar1 = (((FloatVector *)puVar7)->vector_).current_size_;
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->recallconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        if ((iVar1 == 0) || (iVar1 != (((FloatVector *)puVar7)->vector_).current_size_)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_98,"Zero length or mismatched precisionRecallCurves components"
                     ,&local_99);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
          goto LAB_00267b48;
        }
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->precisionvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar5 = 0;
        while ((long)(((FloatVector *)puVar7)->vector_).current_size_ * 4 != lVar5) {
          uVar2 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar5);
          uVar6 = uVar2 & 0x7fffffff;
          lVar5 = lVar5 + 4;
          if ((0x7f7fffff < uVar6 || uVar6 - 1 < 0x7fffff && (int)uVar2 < 0) ||
              uVar6 - 0x800000 < 0x7f000000 && (int)uVar2 < 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_98,
                       "An element of precisionvalues is not a positive number or zero.",&local_99);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_00267b48;
          }
        }
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->precisionconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar5 = 0;
        while ((long)(((FloatVector *)puVar7)->vector_).current_size_ * 4 != lVar5) {
          uVar2 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar5);
          uVar6 = uVar2 & 0x7fffffff;
          lVar5 = lVar5 + 4;
          if ((0x7f7fffff < uVar6 || uVar6 - 1 < 0x7fffff && (int)uVar2 < 0) ||
              uVar6 - 0x800000 < 0x7f000000 && (int)uVar2 < 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_98,
                       "An element of precisionconfidencethresholds is not a positive number or zero."
                       ,&local_99);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_00267b48;
          }
        }
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->recallvalues_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar5 = 0;
        while ((long)(((FloatVector *)puVar7)->vector_).current_size_ * 4 != lVar5) {
          uVar2 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar5);
          uVar6 = uVar2 & 0x7fffffff;
          lVar5 = lVar5 + 4;
          if ((0x7f7fffff < uVar6 || uVar6 - 1 < 0x7fffff && (int)uVar2 < 0) ||
              uVar6 - 0x800000 < 0x7f000000 && (int)uVar2 < 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_98,
                       "An element of recallvalues is not a positive number or zero.",&local_99);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_00267b48;
          }
        }
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::TypeHandler>
                           (&precisionrecallcurves.super_RepeatedPtrFieldBase,index);
        puVar7 = (undefined1 *)pTVar4->recallconfidencethresholds_;
        if ((FloatVector *)puVar7 == (FloatVector *)0x0) {
          puVar7 = Specification::_FloatVector_default_instance_;
        }
        lVar5 = 0;
        while ((long)(((FloatVector *)puVar7)->vector_).current_size_ * 4 != lVar5) {
          uVar2 = *(uint *)((long)(((FloatVector *)puVar7)->vector_).arena_or_elements_ + lVar5);
          uVar6 = uVar2 & 0x7fffffff;
          lVar5 = lVar5 + 4;
          if ((0x7f7fffff < uVar6 || uVar6 - 1 < 0x7fffff && (int)uVar2 < 0) ||
              uVar6 - 0x800000 < 0x7f000000 && (int)uVar2 < 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_98,
                       "An element of recallconfidencethresholds is not a positive number or zero.",
                       &local_99);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_00267b48;
          }
        }
      }
      Result::Result(__return_storage_ptr__);
    }
    google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve>::
    ~RepeatedPtrField(&precisionrecallcurves);
  }
  else {
    Result::Result(__return_storage_ptr__,&result);
  }
  std::__cxx11::string::~string((string *)&result.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_classConfidenceThresholding>(const Specification::Model& format) {
        const auto& interface = format.description();
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // validate precisionRecallCurves
        google::protobuf::RepeatedPtrField<CoreML::Specification::PrecisionRecallCurve> precisionrecallcurves =
                format.classconfidencethresholding().precisionrecallcurves();
        int nCurves = precisionrecallcurves.size();
        if (nCurves > 0) {
            for (int i = 0; i < nCurves; ++i) {
                int precisionvaluesElts = precisionrecallcurves.Get(i).precisionvalues().vector().size();
                int precisionthreshElts = precisionrecallcurves.Get(i).precisionconfidencethresholds().vector().size();
                if (0 == precisionvaluesElts || precisionvaluesElts != precisionthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                
                int recallvaluesElts = precisionrecallcurves.Get(i).recallvalues().vector().size();
                int recallthreshElts = precisionrecallcurves.Get(i).recallconfidencethresholds().vector().size();
                if (0 == recallvaluesElts || recallvaluesElts != recallthreshElts) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Zero length or mismatched precisionRecallCurves components");
                }
                            
                for (auto elt : precisionrecallcurves.Get(i).precisionvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).precisionconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of precisionconfidencethresholds is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallvalues().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallvalues is not a positive number or zero.");
                    }
                }
                
                for (auto elt : precisionrecallcurves.Get(i).recallconfidencethresholds().vector()) {
                    if (std::isinf(elt) || std::isnan(elt) || elt < 0.0f) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "An element of recallconfidencethresholds is not a positive number or zero.");
                    }
                }
            }
            return Result();
        } else {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The ClassConfidenceThresholding model has no precisionRecallCurves.");
        }
    }